

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *psVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  undefined8 uVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  cmGeneratorTarget *this_01;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o;
  string *psVar8;
  undefined8 uVar9;
  string *psVar10;
  string *psVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string reason;
  cmValue imp;
  cmList objects;
  ostringstream e;
  undefined1 local_218 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  cmGeneratorExpressionContext *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [8];
  string *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  pointer local_188;
  undefined8 local_180;
  ios_base local_138 [264];
  
  psVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,psVar1);
  if (this_01 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Objects of target \"",0x13);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\" referenced but no such target exists.",0x27);
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_218,content);
    std::__cxx11::stringbuf::str();
    reportError(context,(string *)local_218,(string *)&local_1f8);
  }
  else {
    TVar5 = cmGeneratorTarget::GetType(this_01);
    if (TVar5 < UTILITY) {
      pcVar2 = context->LG->GlobalGenerator;
      local_218._0_8_ = local_218 + 0x10;
      local_218._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_218[0x10] = '\0';
      local_1b0 = __return_storage_ptr__;
      if ((context->EvaluateForBuildsystem != false) ||
         (bVar4 = cmTarget::HasKnownObjectFileLocation(this_01->Target,(string *)local_218), bVar4))
      {
        if ((string *)local_218._0_8_ != (string *)(local_218 + 0x10)) {
          operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
        }
        local_1d8._M_allocated_capacity = 0;
        local_1d8._8_8_ = (string *)0x0;
        local_1c8._M_allocated_capacity = 0;
        bVar4 = cmGeneratorTarget::IsImported(this_01);
        if (bVar4) {
          local_218._0_8_ = (string *)0x0;
          local_1f8._M_allocated_capacity = 0;
          local_1a0 = (string *)0x0;
          local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffffffffff00;
          local_1a8 = (undefined1  [8])&local_198;
          bVar4 = cmTarget::GetMappedConfig
                            (this_01->Target,&context->Config,(cmValue *)local_218,
                             (cmValue *)&local_1f8._M_allocated_capacity,(string *)local_1a8);
          uVar9 = local_1d8._8_8_;
          uVar3 = local_1d8._M_allocated_capacity;
          if (bVar4) {
            psVar8 = (string *)local_218._0_8_;
            if ((string *)local_218._0_8_ == (string *)0x0) {
              psVar8 = &cmValue::Empty_abi_cxx11_;
            }
            local_1b8 = context;
            if (local_1d8._8_8_ != local_1d8._M_allocated_capacity) {
              psVar10 = (string *)(local_1d8._M_allocated_capacity + 0x10);
              do {
                if (psVar10 != *(string **)(psVar10 + -0x10)) {
                  operator_delete(*(string **)(psVar10 + -0x10),*(long *)psVar10 + 1);
                }
                psVar11 = (string *)(psVar10 + 0x10);
                psVar10 = psVar10 + 0x20;
              } while (psVar11 != (string *)uVar9);
              local_1d8._8_8_ = uVar3;
            }
            cmList::Insert((container_type *)&local_1d8,(const_iterator)local_1d8._8_8_,psVar8,Yes,
                           No);
            context = local_1b8;
          }
          context->HadContextSensitiveCondition = true;
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
          }
        }
        else {
          cmGeneratorTarget::GetTargetObjectNames
                    (this_01,&context->Config,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1d8);
          local_218._0_8_ = local_218 + 0x10;
          local_218._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_218[0x10] = '\0';
          local_1b8 = context;
          if ((context->EvaluateForBuildsystem == true) &&
             (iVar6 = (*pcVar2->_vptr_cmGlobalGenerator[0x38])(pcVar2), (char)iVar6 == '\0')) {
            std::__cxx11::string::_M_assign((string *)local_218);
            bVar4 = cmGeneratorTarget::HasContextDependentSources(this_01);
            context->HadContextSensitiveCondition = bVar4;
          }
          else {
            cmGeneratorTarget::GetObjectDirectory((string *)local_1a8,this_01,&context->Config);
            std::__cxx11::string::operator=((string *)local_218,(string *)local_1a8);
            if (local_1a8 != (undefined1  [8])&local_198) {
              operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
            }
            context->HadContextSensitiveCondition = true;
          }
          uVar3 = local_1d8._8_8_;
          if (local_1d8._M_allocated_capacity != local_1d8._8_8_) {
            uVar9 = local_1d8._M_allocated_capacity;
            do {
              local_1a8 = (undefined1  [8])local_218._8_8_;
              local_1a0 = (string *)local_218._0_8_;
              local_198._M_allocated_capacity = 0;
              local_188 = (((string *)uVar9)->_M_dataplus)._M_p;
              local_198._8_8_ = ((string *)uVar9)->_M_string_length;
              local_180 = 0;
              views._M_len = 2;
              views._M_array = (iterator)local_1a8;
              cmCatViews((string *)&local_1f8,views);
              std::__cxx11::string::operator=((string *)uVar9,(string *)local_1f8._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_allocated_capacity != &local_1e8) {
                operator_delete((void *)local_1f8._M_allocated_capacity,
                                local_1e8._M_allocated_capacity + 1);
              }
              uVar9 = uVar9 + 0x20;
            } while (uVar9 != uVar3);
          }
          context = local_1b8;
          if ((string *)local_218._0_8_ != (string *)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
            context = local_1b8;
          }
        }
        psVar8 = local_1b0;
        uVar3 = local_1d8._8_8_;
        if (local_1d8._M_allocated_capacity != local_1d8._8_8_) {
          this_00 = context->LG->Makefile;
          uVar9 = local_1d8._M_allocated_capacity;
          do {
            cmMakefile::AddTargetObject(this_00,psVar1,(string *)uVar9);
            uVar9 = uVar9 + 0x20;
          } while (uVar9 != uVar3);
        }
        cmList::to_string_abi_cxx11_(psVar8,(cmList *)&local_1d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1d8);
        return psVar8;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                 ,0x6c);
      psVar1 = local_1b0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_218._0_8_,local_218._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,").  It is not suitable for writing out elsewhere.",0x31);
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&local_1f8,content);
      std::__cxx11::stringbuf::str();
      reportError(context,(string *)&local_1f8,(string *)&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_allocated_capacity != &local_1c8) {
        operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_allocated_capacity != &local_1e8) {
        operator_delete((void *)local_1f8._M_allocated_capacity,local_1e8._M_allocated_capacity + 1)
        ;
      }
      (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
      psVar1->_M_string_length = 0;
      (psVar1->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((string *)local_218._0_8_ == (string *)(local_218 + 0x10)) {
        return psVar1;
      }
      operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
      return psVar1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Objects of target \"",0x13);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\" referenced but is not one of the allowed target types ",0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"(EXECUTABLE, STATIC, SHARED, MODULE, OBJECT).",0x2d);
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_218,content);
    std::__cxx11::stringbuf::str();
    reportError(context,(string *)local_218,(string *)&local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_allocated_capacity != &local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity,local_1e8._M_allocated_capacity + 1);
  }
  if ((string *)local_218._0_8_ != (string *)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::STATIC_LIBRARY &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY &&
        type != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not one of the allowed target types "
        << "(EXECUTABLE, STATIC, SHARED, MODULE, OBJECT).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    {
      std::string reason;
      if (!context->EvaluateForBuildsystem &&
          !gt->Target->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason
          << ").  "
             "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    cmList objects;

    if (gt->IsImported()) {
      cmValue loc = nullptr;
      cmValue imp = nullptr;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, loc, imp, suffix)) {
        objects.assign(*loc);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem && !gg->SupportsCrossConfigs()) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        context->HadContextSensitiveCondition =
          gt->HasContextDependentSources();
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (auto& o : objects) {
        o = cmStrCat(obj_dir, o);
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::string const& o : objects) {
      mf->AddTargetObject(tgtName, o);
    }

    return objects.to_string();
  }